

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

void __thiscall cpp_db::transaction::commit(transaction *this)

{
  element_type *peVar1;
  element_type *peVar2;
  shared_ptr<cpp_db::transaction_interface> local_30;
  shared_ptr<cpp_db::connection_interface> local_20;
  transaction *local_10;
  transaction *this_local;
  
  local_10 = this;
  peVar1 = std::
           __shared_ptr_access<cpp_db::transaction_interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cpp_db::transaction_interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->trans_impl);
  (*peVar1->_vptr_transaction_interface[3])();
  tools::lock_or_throw<cpp_db::connection_interface>
            ((tools *)&local_20,&this->conn_impl,"Invalid database connection");
  peVar2 = std::
           __shared_ptr_access<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_20);
  std::shared_ptr<cpp_db::transaction_interface>::shared_ptr(&local_30,(nullptr_t)0x0);
  (*peVar2->_vptr_connection_interface[6])(peVar2,&local_30);
  std::shared_ptr<cpp_db::transaction_interface>::~shared_ptr(&local_30);
  std::shared_ptr<cpp_db::connection_interface>::~shared_ptr(&local_20);
  return;
}

Assistant:

void transaction::commit()
{
	trans_impl->commit();
    tools::lock_or_throw(conn_impl, "Invalid database connection")->set_current_transaction(nullptr);
}